

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelogger.c
# Opt level: O3

void consolelogger_log(LOG_CATEGORY log_category,char *file,char *func,int line,uint options,
                      char *format,...)

{
  char in_AL;
  char *pcVar1;
  char *pcVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  time_t t;
  undefined8 local_108;
  void **local_100;
  undefined1 *local_f8;
  time_t local_f0;
  undefined1 local_e8 [48];
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_f8 = local_e8;
  local_100 = &args[0].overflow_arg_area;
  local_108 = 0x3000000030;
  local_f0 = get_time((time_t *)0x0);
  pcVar1 = get_ctime(&local_f0);
  if (log_category == AZ_LOG_ERROR) {
    pcVar2 = "<NO TIME IMPL>";
    if (pcVar1 != (char *)0x0) {
      pcVar2 = pcVar1;
    }
    printf("Error: Time:%.24s File:%s Func:%s Line:%d ",pcVar2,file,func,(ulong)(uint)line);
  }
  else if (log_category == AZ_LOG_INFO) {
    printf("Info: ");
  }
  vprintf(format,&local_108);
  if ((options & 1) != 0) {
    puts("\r");
  }
  return;
}

Assistant:

__attribute__ ((format (printf, 6, 7)))
#endif
void consolelogger_log(LOG_CATEGORY log_category, const char* file, const char* func, int line, unsigned int options, const char* format, ...)
{
    time_t t;
    char* timeString;
    va_list args;
    va_start(args, format);

#if LOGGER_DISABLE_PAL
    t = time(NULL);
    timeString = ctime(&t);
#else  // LOGGER_DISABLE_PAL
    t = get_time(NULL);
    timeString = get_ctime(&t);
#endif // LOGGER_DISABLE_PAL

    // In case time is not implemented
    timeString = timeString == NULL ? "<NO TIME IMPL>" : timeString;

    switch (log_category)
    {
    case AZ_LOG_INFO:
        (void)printf("Info: ");
        break;
    case AZ_LOG_ERROR:
        (void)printf("Error: Time:%.24s File:%s Func:%s Line:%d ", timeString, file, func, line);
        break;
    default:
        break;
    }

    (void)vprintf(format, args);
    va_end(args);

    (void)log_category;
    if (options & LOG_LINE)
    {
        (void)printf("\r\n");
    }
}